

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

set<Catch::Verbosity,_std::less<Catch::Verbosity>,_std::allocator<Catch::Verbosity>_> *
Catch::ListeningReporter::getSupportedVerbosities(void)

{
  set<Catch::Verbosity,_std::less<Catch::Verbosity>,_std::allocator<Catch::Verbosity>_> *in_RDI;
  
  memset(in_RDI,0,0x30);
  clara::std::set<Catch::Verbosity,_std::less<Catch::Verbosity>,_std::allocator<Catch::Verbosity>_>
  ::set((set<Catch::Verbosity,_std::less<Catch::Verbosity>,_std::allocator<Catch::Verbosity>_> *)
        0x144ada);
  return in_RDI;
}

Assistant:

std::set<Verbosity> ListeningReporter::getSupportedVerbosities() {
        return std::set<Verbosity>{ };
    }